

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

errr get_rnd_line(char *file_name,char *output)

{
  _Bool _Var1;
  uint32_t uVar2;
  int local_434;
  int counter;
  int line;
  int lines;
  char buf [1024];
  ang_file *fp;
  char *output_local;
  char *file_name_local;
  
  path_build((char *)&line,0x400,ANGBAND_DIR_GAMEDATA,file_name);
  buf._1016_8_ = file_open((char *)&line,MODE_READ,FTYPE_TEXT);
  if ((ang_file *)buf._1016_8_ == (ang_file *)0x0) {
    file_name_local._4_4_ = -1;
  }
  else {
    _Var1 = file_getl((ang_file *)buf._1016_8_,(char *)&line,0x50);
    if (_Var1) {
      uVar2 = atoi((char *)&line);
      uVar2 = Rand_div(uVar2);
      for (local_434 = 0; local_434 <= (int)(uVar2 + 1); local_434 = local_434 + 1) {
        _Var1 = file_getl((ang_file *)buf._1016_8_,(char *)&line,0x50);
        if (!_Var1) {
          return 1;
        }
        if (local_434 == uVar2 + 1) break;
      }
      strcpy(output,(char *)&line);
      file_close((ang_file *)buf._1016_8_);
      file_name_local._4_4_ = 0;
    }
    else {
      file_name_local._4_4_ = 1;
    }
  }
  return file_name_local._4_4_;
}

Assistant:

errr get_rnd_line(const char *file_name, char *output)
{
	ang_file *fp;
	char buf[1024];
	int lines = 0, line, counter;

	/* Build the filename */
	path_build(buf, 1024, ANGBAND_DIR_GAMEDATA, file_name);

	/* Open the file */
	fp = file_open(buf, MODE_READ, FTYPE_TEXT);

	/* Failed */
	if (!fp)
		return (-1);

	/* Parse the file */
	if (file_getl(fp, buf, 80))
		lines = atoi(buf);
	else
		return (1);

	/* choose a random line */
	line = randint1(lines);

	for (counter = 0; counter <= line; counter++) {
		if (!(file_getl(fp, buf, 80)))
			return (1);
		else if (counter == line)
			break;
	}

	strcpy(output, buf);

	/* Close the file */
	file_close(fp);

	return (0);
}